

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O2

void tcg_out_movi(TCGContext_conflict9 *s,TCGType_conflict type,TCGReg ret,tcg_target_long arg)

{
  byte *pbVar1;
  tcg_insn_unit *ptVar2;
  byte *pbVar3;
  uint uVar4;
  int *piVar5;
  tcg_target_long *ptVar6;
  uint uVar7;
  intptr_t addend;
  int in_R9D;
  int iVar8;
  long lVar9;
  
  if (type - TCG_TYPE_V64 < 3) {
LAB_00b2636e:
    uVar4 = (uint)(type == TCG_TYPE_V256) << 0x13;
    if (arg == -1) {
      uVar4 = uVar4 | 0x574;
    }
    else {
      if (arg != 0) {
        uVar7 = 0x40112;
        if (have_avx2_tricore) {
          uVar7 = uVar4 | 0x659;
        }
        uVar4 = 0x2017e;
        if (type != TCG_TYPE_V64) {
          uVar4 = uVar7;
        }
        addend = 0;
        tcg_out_vex_opc(s,uVar4,ret,0,0,in_R9D);
        pbVar1 = s->code_ptr;
        pbVar3 = pbVar1 + 1;
        s->code_ptr = pbVar3;
        *pbVar1 = ((byte)ret & 7) << 3 | 5;
        ptVar2 = s->code_ptr;
        ptVar2[0] = '\0';
        ptVar2[1] = '\0';
        ptVar2[2] = '\0';
        ptVar2[3] = '\0';
        s->code_ptr = ptVar2 + 4;
        new_pool_label(s,arg,(int)ptVar2,pbVar3,addend);
        return;
      }
      uVar4 = 0x5ef;
    }
    tcg_out_vex_modrm(s,uVar4,ret,ret,ret);
    return;
  }
  if (TCG_TYPE_I64 < type) {
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
               ,0x3ee,(char *)0x0);
  }
  if (TCG_REG_R15 < ret) goto LAB_00b2636e;
  if (arg == 0) {
    tcg_out_modrm(s,0x33,ret,ret);
    return;
  }
  if (type == TCG_TYPE_I32 || (ulong)arg >> 0x20 == 0) {
    tcg_out_opc(s,ret | 0xb8,0,ret,0);
LAB_00b2645c:
    piVar5 = (int *)s->code_ptr;
    *piVar5 = (int)arg;
  }
  else {
    if ((int)arg == arg) {
      tcg_out_modrm(s,0x10c7,0,ret);
      goto LAB_00b2645c;
    }
    lVar9 = (arg - (long)s->code_ptr) + -7;
    iVar8 = (int)lVar9;
    if (iVar8 != lVar9) {
      tcg_out_opc(s,ret | 0x10b8,0,ret,0);
      ptVar6 = (tcg_target_long *)s->code_ptr;
      *ptVar6 = arg;
      ptVar6 = ptVar6 + 1;
      goto LAB_00b2646a;
    }
    tcg_out_opc(s,0x108d,ret,0,0);
    pbVar3 = s->code_ptr;
    s->code_ptr = pbVar3 + 1;
    *pbVar3 = ((byte)ret & 7) << 3 | 5;
    piVar5 = (int *)s->code_ptr;
    *piVar5 = iVar8;
  }
  ptVar6 = (tcg_target_long *)(piVar5 + 1);
LAB_00b2646a:
  s->code_ptr = (tcg_insn_unit *)ptVar6;
  return;
}

Assistant:

static void tcg_out_movi(TCGContext *s, TCGType type,
                         TCGReg ret, tcg_target_long arg)
{
    tcg_target_long diff;

    switch (type) {
    case TCG_TYPE_I32:
#if TCG_TARGET_REG_BITS == 64
    case TCG_TYPE_I64:
#endif
        if (ret < 16) {
            break;
        }
        /* fallthru */
    case TCG_TYPE_V64:
    case TCG_TYPE_V128:
    case TCG_TYPE_V256:
        tcg_debug_assert(ret >= 16);
        tcg_out_dupi_vec(s, type, ret, arg);
        return;
    default:
        g_assert_not_reached();
    }

    if (arg == 0) {
        tgen_arithr(s, ARITH_XOR, ret, ret);
        return;
    }
    if (arg == (uint32_t)arg || type == TCG_TYPE_I32) {
        tcg_out_opc(s, OPC_MOVL_Iv + LOWREGMASK(ret), 0, ret, 0);
        tcg_out32(s, arg);
        return;
    }
    if (arg == (int32_t)arg) {
        tcg_out_modrm(s, OPC_MOVL_EvIz + P_REXW, 0, ret);
        tcg_out32(s, arg);
        return;
    }

    /* Try a 7 byte pc-relative lea before the 10 byte movq.  */
    diff = arg - ((uintptr_t)s->code_ptr + 7);
    if (diff == (int32_t)diff) {
        tcg_out_opc(s, OPC_LEA | P_REXW, ret, 0, 0);
        tcg_out8(s, (LOWREGMASK(ret) << 3) | 5);
        tcg_out32(s, diff);
        return;
    }

    tcg_out_opc(s, OPC_MOVL_Iv + P_REXW + LOWREGMASK(ret), 0, ret, 0);
    tcg_out64(s, arg);
}